

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Gia_Man_t * Gia_ManDupWithMuxPos(Gia_Man_t *p)

{
  Vec_Bit_t *pVVar1;
  int iVar2;
  int iVar3;
  int i_00;
  int i_01;
  int iVar4;
  Gia_Man_t *p_00;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_01;
  Gia_Obj_t *pObj_02;
  bool bVar6;
  Gia_Obj_t *pData1_1;
  Gia_Obj_t *pData0_1;
  Gia_Obj_t *pCtrl_1;
  Gia_Obj_t *pObj_1;
  int iData1;
  int iData0;
  int iCtrl;
  int iObj_1;
  int iObj;
  int i;
  Gia_Man_t *pNew;
  Gia_Obj_t *pData1;
  Gia_Obj_t *pData0;
  Gia_Obj_t *pCtrl;
  Gia_Obj_t *pObj;
  Vec_Bit_t *vDatas;
  Vec_Bit_t *vHeads;
  Vec_Int_t *vQuads;
  Vec_Int_t *vPoints;
  Gia_Man_t *p_local;
  
  vPoints = (Vec_Int_t *)p;
  vQuads = Vec_IntAlloc(1000);
  vHeads = (Vec_Bit_t *)Vec_IntAlloc(1000);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vPoints);
  vDatas = Vec_BitStart(iVar2);
  iVar2 = Gia_ManObjNum((Gia_Man_t *)vPoints);
  pObj = (Gia_Obj_t *)Vec_BitStart(iVar2);
  p_00 = Gia_ManDup((Gia_Man_t *)vPoints);
  iVar2 = Gia_ManRegNum(p_00);
  if (iVar2 == 0) {
    iObj_1 = 0;
    while( true ) {
      bVar6 = false;
      if (iObj_1 < p_00->nObjs) {
        pCtrl = Gia_ManObj(p_00,iObj_1);
        bVar6 = pCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      iVar2 = Gia_ObjIsAnd(pCtrl);
      if ((iVar2 != 0) && (iVar2 = Gia_ObjIsMuxType(pCtrl), iVar2 != 0)) {
        pData0 = Gia_ObjRecognizeMux(pCtrl,(Gia_Obj_t **)&pNew,&pData1);
        pData0 = Gia_Regular(pData0);
        pData1 = Gia_Regular(pData1);
        pNew = (Gia_Man_t *)Gia_Regular((Gia_Obj_t *)pNew);
        pVVar1 = vHeads;
        iVar2 = Gia_ObjId(p_00,pCtrl);
        iVar3 = Gia_ObjId(p_00,pData0);
        Vec_IntPushTwo((Vec_Int_t *)pVVar1,iVar2,iVar3);
        pVVar1 = vHeads;
        iVar2 = Gia_ObjId(p_00,pData1);
        iVar3 = Gia_ObjId(p_00,(Gia_Obj_t *)pNew);
        Vec_IntPushTwo((Vec_Int_t *)pVVar1,iVar2,iVar3);
        pVVar1 = vDatas;
        iVar2 = Gia_ObjId(p_00,pCtrl);
        Vec_BitWriteEntry(pVVar1,iVar2,1);
        pGVar5 = pObj;
        iVar2 = Gia_ObjId(p_00,pData1);
        Vec_BitWriteEntry((Vec_Bit_t *)pGVar5,iVar2,1);
        pGVar5 = pObj;
        iVar2 = Gia_ObjId(p_00,(Gia_Obj_t *)pNew);
        Vec_BitWriteEntry((Vec_Bit_t *)pGVar5,iVar2,1);
      }
      iObj_1 = iObj_1 + 1;
    }
    iObj_1 = 0;
    while( true ) {
      iVar2 = Vec_IntSize(p_00->vCos);
      bVar6 = false;
      if (iObj_1 < iVar2) {
        pCtrl = Gia_ManCo(p_00,iObj_1);
        bVar6 = pCtrl != (Gia_Obj_t *)0x0;
      }
      if (!bVar6) break;
      pGVar5 = Gia_ObjFanin0(pCtrl);
      *(ulong *)pGVar5 = *(ulong *)pGVar5 & 0xffffffffbfffffff | 0x40000000;
      iObj_1 = iObj_1 + 1;
    }
    for (iObj_1 = 0; iVar2 = Vec_IntSize((Vec_Int_t *)vHeads), iObj_1 < iVar2 / 4;
        iObj_1 = iObj_1 + 1) {
      iVar2 = Vec_IntEntry((Vec_Int_t *)vHeads,iObj_1 << 2);
      iVar3 = Vec_IntEntry((Vec_Int_t *)vHeads,iObj_1 * 4 + 1);
      i_00 = Vec_IntEntry((Vec_Int_t *)vHeads,iObj_1 * 4 + 2);
      i_01 = Vec_IntEntry((Vec_Int_t *)vHeads,iObj_1 * 4 + 3);
      iVar4 = Vec_BitEntry(vDatas,iVar2);
      if ((((iVar4 != 0) && (iVar4 = Vec_BitEntry((Vec_Bit_t *)pObj,iVar2), iVar4 != 0)) ||
          ((iVar4 = Vec_BitEntry(vDatas,i_00), iVar4 != 0 &&
           (iVar4 = Vec_BitEntry((Vec_Bit_t *)pObj,i_00), iVar4 != 0)))) ||
         ((iVar4 = Vec_BitEntry(vDatas,i_01), iVar4 != 0 &&
          (iVar4 = Vec_BitEntry((Vec_Bit_t *)pObj,i_01), iVar4 != 0)))) {
        pGVar5 = Gia_ManObj((Gia_Man_t *)vPoints,iVar2);
        pObj_00 = Gia_ManObj((Gia_Man_t *)vPoints,iVar3);
        pObj_01 = Gia_ManObj((Gia_Man_t *)vPoints,i_00);
        pObj_02 = Gia_ManObj((Gia_Man_t *)vPoints,i_01);
        iVar4 = Gia_ObjIsAnd(pGVar5);
        if ((iVar4 != 0) && ((*(ulong *)pGVar5 >> 0x1e & 1) == 0)) {
          Vec_IntPush(vQuads,iVar2);
        }
        iVar2 = Gia_ObjIsAnd(pObj_00);
        if ((iVar2 != 0) && ((*(ulong *)pObj_00 >> 0x1e & 1) == 0)) {
          Vec_IntPush(vQuads,iVar3);
        }
        iVar2 = Gia_ObjIsAnd(pObj_01);
        if ((iVar2 != 0) && ((*(ulong *)pObj_01 >> 0x1e & 1) == 0)) {
          Vec_IntPush(vQuads,i_00);
        }
        iVar2 = Gia_ObjIsAnd(pObj_02);
        if ((iVar2 != 0) && ((*(ulong *)pObj_02 >> 0x1e & 1) == 0)) {
          Vec_IntPush(vQuads,i_01);
        }
      }
    }
    Gia_ManCleanMark0(p_00);
    Vec_IntUniqify(vQuads);
    for (iObj_1 = 0; iVar2 = Vec_IntSize(vQuads), iObj_1 < iVar2; iObj_1 = iObj_1 + 1) {
      iVar2 = Vec_IntEntry(vQuads,iObj_1);
      iVar2 = Abc_Var2Lit(iVar2,0);
      Gia_ManAppendCo(p_00,iVar2);
    }
    Vec_IntFree(vQuads);
    Vec_IntFree((Vec_Int_t *)vHeads);
    Vec_BitFree(vDatas);
    Vec_BitFree((Vec_Bit_t *)pObj);
    return p_00;
  }
  __assert_fail("Gia_ManRegNum(pNew) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                ,0x8d2,"Gia_Man_t *Gia_ManDupWithMuxPos(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupWithMuxPos( Gia_Man_t * p )
{
    Vec_Int_t * vPoints = Vec_IntAlloc( 1000 );
    Vec_Int_t * vQuads  = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vHeads  = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vDatas  = Vec_BitStart( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj, * pCtrl, * pData0, * pData1;
    Gia_Man_t * pNew = Gia_ManDup( p ); int i, iObj;
    assert( Gia_ManRegNum(pNew) == 0 );
    Gia_ManForEachAnd( pNew, pObj, i )
    {
        if ( !Gia_ObjIsMuxType(pObj) )
            continue;
        pCtrl  = Gia_ObjRecognizeMux( pObj, &pData1, &pData0 );
        pCtrl  = Gia_Regular(pCtrl);
        pData0 = Gia_Regular(pData0);
        pData1 = Gia_Regular(pData1);
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pObj),   Gia_ObjId(pNew, pCtrl)  );
        Vec_IntPushTwo( vQuads, Gia_ObjId(pNew, pData0), Gia_ObjId(pNew, pData1) );
        Vec_BitWriteEntry( vHeads, Gia_ObjId(pNew, pObj),   1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData0), 1 );
        Vec_BitWriteEntry( vDatas, Gia_ObjId(pNew, pData1), 1 );
    }
    Gia_ManForEachCo( pNew, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    for ( i = 0; i < Vec_IntSize(vQuads)/4; i++ )
    {
        int iObj   = Vec_IntEntry( vQuads, 4*i+0 );
        int iCtrl  = Vec_IntEntry( vQuads, 4*i+1 );
        int iData0 = Vec_IntEntry( vQuads, 4*i+2 );
        int iData1 = Vec_IntEntry( vQuads, 4*i+3 );
        if ( (Vec_BitEntry(vHeads, iObj)   && Vec_BitEntry(vDatas, iObj))   || 
             (Vec_BitEntry(vHeads, iData0) && Vec_BitEntry(vDatas, iData0)) || 
             (Vec_BitEntry(vHeads, iData1) && Vec_BitEntry(vDatas, iData1)) )
        {
            Gia_Obj_t * pObj   = Gia_ManObj( p, iObj );
            Gia_Obj_t * pCtrl  = Gia_ManObj( p, iCtrl );
            Gia_Obj_t * pData0 = Gia_ManObj( p, iData0 );
            Gia_Obj_t * pData1 = Gia_ManObj( p, iData1 );
            if ( Gia_ObjIsAnd(pObj)   && !pObj->fMark0   )  Vec_IntPush( vPoints, iObj   );
            if ( Gia_ObjIsAnd(pCtrl)  && !pCtrl->fMark0  )  Vec_IntPush( vPoints, iCtrl  );
            if ( Gia_ObjIsAnd(pData0) && !pData0->fMark0 )  Vec_IntPush( vPoints, iData0 );
            if ( Gia_ObjIsAnd(pData1) && !pData1->fMark0 )  Vec_IntPush( vPoints, iData1 );
        }
    }
    Gia_ManCleanMark0( pNew );
    Vec_IntUniqify( vPoints );
    Vec_IntForEachEntry( vPoints, iObj, i )
        Gia_ManAppendCo( pNew, Abc_Var2Lit(iObj, 0) );
    Vec_IntFree( vPoints );
    Vec_IntFree( vQuads );
    Vec_BitFree( vHeads );
    Vec_BitFree( vDatas );
    return pNew;
}